

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,false,false>
               (dtime_t *ldata,interval_t *rdata,dtime_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  dtime_t left;
  dtime_t left_00;
  dtime_t *pdVar3;
  ulong uVar4;
  dtime_t dVar5;
  ulong uVar6;
  int64_t *piVar7;
  idx_t iVar8;
  ulong uVar9;
  ValidityMask *pVVar10;
  ulong uVar11;
  ulong uVar12;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  ValidityMask *local_60;
  dtime_t *local_58;
  idx_t local_50;
  ulong local_48;
  dtime_t *local_40;
  dtime_t *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar7 = &rdata->micros;
      iVar8 = 0;
      do {
        dVar5.micros._0_4_ = ((interval_t *)(piVar7 + -1))->months;
        dVar5.micros._4_4_ = ((interval_t *)(piVar7 + -1))->days;
        local_64 = 0;
        right_01.micros = (int64_t)&local_64;
        right_01._0_8_ = -*piVar7;
        dVar5 = Interval::Add((Interval *)ldata[iVar8].micros,dVar5,right_01,(date_t *)mask);
        result_data[iVar8].micros = dVar5.micros;
        iVar8 = iVar8 + 1;
        piVar7 = piVar7 + 2;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    uVar6 = 0;
    uVar12 = 0;
    local_60 = mask;
    local_58 = ldata;
    local_50 = count;
    do {
      pdVar3 = local_58;
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      pVVar10 = mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
LAB_010992d8:
        uVar4 = uVar6;
        if (uVar6 < uVar9) {
          piVar7 = &rdata[uVar6].micros;
          do {
            left.micros._0_4_ = ((interval_t *)(piVar7 + -1))->months;
            left.micros._4_4_ = ((interval_t *)(piVar7 + -1))->days;
            local_6c = 0;
            right.micros = (int64_t)&local_6c;
            right._0_8_ = -*piVar7;
            dVar5 = Interval::Add((Interval *)pdVar3[uVar6].micros,left,right,(date_t *)mask);
            result_data[uVar6].micros = dVar5.micros;
            uVar6 = uVar6 + 1;
            piVar7 = piVar7 + 2;
            uVar4 = uVar9;
            pVVar10 = local_60;
            count = local_50;
          } while (uVar9 != uVar6);
        }
      }
      else {
        uVar2 = puVar1[uVar12];
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
        uVar4 = uVar9;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_010992d8;
          uVar4 = uVar6;
          if (uVar6 < uVar9) {
            local_38 = result_data + uVar6;
            local_40 = local_58 + uVar6;
            piVar7 = &rdata[uVar6].micros;
            uVar11 = 0;
            do {
              if ((uVar2 >> (uVar11 & 0x3f) & 1) != 0) {
                left_00.micros._0_4_ = ((interval_t *)(piVar7 + -1))->months;
                left_00.micros._4_4_ = ((interval_t *)(piVar7 + -1))->days;
                local_68 = 0;
                right_00.micros = (int64_t)&local_68;
                right_00._0_8_ = -*piVar7;
                dVar5 = Interval::Add((Interval *)local_40[uVar11].micros,left_00,right_00,
                                      (date_t *)mask);
                local_38[uVar11].micros = dVar5.micros;
              }
              uVar11 = uVar11 + 1;
              piVar7 = piVar7 + 2;
              uVar4 = uVar9;
              pVVar10 = local_60;
              count = local_50;
            } while (uVar9 - uVar6 != uVar11);
          }
        }
      }
      uVar6 = uVar4;
      uVar12 = uVar12 + 1;
      mask = pVVar10;
    } while (uVar12 != local_48);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}